

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGhsMultiGenerator::WriteHighLevelDirectives
          (cmGlobalGhsMultiGenerator *this,ostream *fout,cmLocalGenerator *root)

{
  cmMakefile *pcVar1;
  cmake *this_00;
  cmValue cVar2;
  ostream *poVar3;
  string *psVar4;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  pcVar1 = root->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"GHS_PRIMARY_TARGET",&local_61);
  cVar2 = cmMakefile::GetDefinition(pcVar1,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  poVar3 = std::operator<<(fout,"primaryTarget=");
  poVar3 = operator<<(poVar3,cVar2);
  poVar3 = std::operator<<(poVar3,"\ncustomization=");
  psVar4 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(root);
  poVar3 = std::operator<<(poVar3,(string *)psVar4);
  poVar3 = std::operator<<(poVar3,"/CMakeFiles/custom_rule.bod\ncustomization=");
  psVar4 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(root);
  poVar3 = std::operator<<(poVar3,(string *)psVar4);
  poVar3 = std::operator<<(poVar3,"/CMakeFiles/custom_target.bod");
  std::operator<<(poVar3,'\n');
  pcVar1 = root->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"GHS_CUSTOMIZATION",&local_61);
  cVar2 = cmMakefile::GetDefinition(pcVar1,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if ((cVar2.Value != (string *)0x0) && ((cVar2.Value)->_M_string_length != 0)) {
    poVar3 = std::operator<<(fout,"customization=");
    std::__cxx11::string::string((string *)&local_40,(string *)cVar2.Value);
    TrimQuotes(&local_60,&local_40);
    poVar3 = std::operator<<(poVar3,(string *)&local_60);
    std::operator<<(poVar3,'\n');
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    this_00 = (this->super_cmGlobalGenerator).CMakeInstance;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"GHS_CUSTOMIZATION",&local_61);
    cmake::MarkCliAsUsed(this_00,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteHighLevelDirectives(
  std::ostream& fout, cmLocalGenerator* root)
{
  /* put primary target and customization files into project file */
  cmValue const tgt = root->GetMakefile()->GetDefinition("GHS_PRIMARY_TARGET");

  /* clang-format off */
  fout << "primaryTarget=" << tgt << "\n"
          "customization=" << root->GetBinaryDirectory()
       << "/CMakeFiles/custom_rule.bod\n"
          "customization=" << root->GetBinaryDirectory()
       << "/CMakeFiles/custom_target.bod" << '\n';
  /* clang-format on */

  cmValue const customization =
    root->GetMakefile()->GetDefinition("GHS_CUSTOMIZATION");
  if (cmNonempty(customization)) {
    fout << "customization="
         << cmGlobalGhsMultiGenerator::TrimQuotes(*customization) << '\n';
    this->GetCMakeInstance()->MarkCliAsUsed("GHS_CUSTOMIZATION");
  }
}